

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meshes.cpp
# Opt level: O0

Mesh * vera::lineMesh(Mesh *__return_storage_ptr__,vec3 *_a,vec3 *_b)

{
  vec<3,_float,_(glm::qualifier)0> local_50;
  vec<3,_float,_(glm::qualifier)0> local_44;
  undefined1 local_38 [8];
  vec3 linePoints [2];
  vec3 *_b_local;
  vec3 *_a_local;
  Mesh *mesh;
  
  linePoints[1]._4_8_ = _b;
  glm::vec<3,_float,_(glm::qualifier)0>::vec
            (&local_44,(_a->field_0).x,(_a->field_1).y,(_a->field_2).z);
  linePoints[0].field_0.x = local_44.field_2.z;
  local_38._0_4_ = local_44.field_0;
  local_38._4_4_ = local_44.field_1;
  glm::vec<3,_float,_(glm::qualifier)0>::vec
            (&local_50,*(float *)linePoints[1]._4_8_,*(float *)(linePoints[1]._4_8_ + 4),
             *(float *)(linePoints[1]._4_8_ + 8));
  linePoints[1].field_0.x = local_50.field_2.z;
  linePoints[0].field_1.y = local_50.field_0.x;
  linePoints[0].field_2.z = local_50.field_1.y;
  Mesh::Mesh(__return_storage_ptr__);
  Mesh::addVertices(__return_storage_ptr__,(vec3 *)local_38,2);
  Mesh::setDrawMode(__return_storage_ptr__,LINES);
  return __return_storage_ptr__;
}

Assistant:

Mesh lineMesh(const glm::vec3 &_a, const glm::vec3 &_b) {
    glm::vec3 linePoints[2];
    linePoints[0] = glm::vec3(_a.x,_a.y,_a.z);
    linePoints[1] = glm::vec3(_b.x,_b.y,_b.z);;

    Mesh mesh;
    mesh.addVertices(linePoints,2);
    mesh.setDrawMode(LINES);
    return mesh;
}